

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O1

ion_status_t sl_delete(ion_skiplist_t *skiplist,ion_key_t key)

{
  sl_node ***pppsVar1;
  ion_key_size_t iVar2;
  sl_node *__ptr;
  sl_node **ppsVar3;
  sl_node *psVar4;
  bool bVar5;
  char cVar6;
  long lVar7;
  ion_status_t iVar8;
  ion_sl_node_t *piVar9;
  ion_sl_node_t *piVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  
  piVar9 = skiplist->head;
  if ((long)piVar9->height < 0) {
    iVar8.error = '\x01';
    iVar8._1_3_ = 0;
    iVar8.count = 0;
  }
  else {
    iVar2 = (skiplist->super).record.key_size;
    uVar13 = 1;
    uVar11 = 0;
    lVar12 = (long)piVar9->height;
    do {
      while( true ) {
        pppsVar1 = &piVar9->next;
        if ((piVar9->next[lVar12] == (sl_node *)0x0) ||
           (cVar6 = (*(skiplist->super).compare)(piVar9->next[lVar12]->key,key,iVar2), -1 < cVar6))
        break;
        piVar9 = (*pppsVar1)[lVar12];
      }
      if ((piVar9->next[lVar12] != (sl_node *)0x0) &&
         (cVar6 = (*(skiplist->super).compare)(piVar9->next[lVar12]->key,key,iVar2), cVar6 == '\0'))
      {
        while (((*pppsVar1)[lVar12] != (sl_node *)0x0 &&
               (cVar6 = (*(skiplist->super).compare)((*pppsVar1)[lVar12]->key,key,iVar2),
               cVar6 == '\0'))) {
          __ptr = (*pppsVar1)[lVar12];
          lVar7 = (long)__ptr->height;
          psVar4 = piVar9;
          if (-1 < lVar7) {
            do {
              do {
                piVar10 = psVar4;
                ppsVar3 = piVar10->next;
                psVar4 = ppsVar3[lVar7];
              } while (psVar4 != __ptr);
              ppsVar3[lVar7] = __ptr->next[lVar7];
              bVar5 = 0 < lVar7;
              psVar4 = piVar10;
              lVar7 = lVar7 + -1;
            } while (bVar5);
          }
          free(__ptr->key);
          free(__ptr->value);
          free(__ptr->next);
          free(__ptr);
          uVar11 = uVar11 + 1;
        }
        uVar13 = 0;
      }
      bVar5 = 0 < lVar12;
      lVar12 = lVar12 + -1;
    } while (bVar5);
    iVar8 = (ion_status_t)(uVar13 | (ulong)uVar11 << 0x20);
  }
  return iVar8;
}

Assistant:

ion_status_t
sl_delete(
	ion_skiplist_t	*skiplist,
	ion_key_t		key
) {
	ion_key_size_t key_size = skiplist->super.record.key_size;
	/* Default return is no item */
	ion_status_t status;

	status			= ION_STATUS_INITIALIZE;
	/* If we fall through, then we didn't find what we were looking for. */
	status.error	= err_item_not_found;

	ion_sl_node_t	*cursor = skiplist->head;
	ion_sl_level_t	h;

	for (h = skiplist->head->height; h >= 0; --h) {
		while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) < 0) {
			cursor = cursor->next[h];
		}

		if ((NULL != cursor->next[h]) && (skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0)) {
			ion_sl_node_t *oldcursor = cursor;

			while (NULL != cursor->next[h] && skiplist->super.compare(cursor->next[h]->key, key, key_size) == 0) {
				ion_sl_node_t	*tofree = cursor->next[h];
				ion_sl_node_t	*relink = cursor->next[h];
				ion_sl_level_t	link_h	= relink->height;

				while (link_h >= 0) {
					while (cursor->next[link_h] != relink) {
						cursor = cursor->next[link_h];
					}

					ion_sl_node_t *jump = relink->next[link_h];

					cursor->next[link_h] = jump;
					link_h--;
				}

				free(tofree->key);
				free(tofree->value);
				free(tofree->next);
				free(tofree);

				cursor = oldcursor;
				status.count++;
			}

			status.error = err_ok;
		}
	}

	return status;
}